

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O1

int stopcheck2_mt(double fx,int N,double fo,double *jac,double *dx,double eps,double stoptol,
                 double functol,int retval)

{
  int iVar1;
  double dVar2;
  
  if (retval == 3) {
    return 4;
  }
  if (retval == 0xf) {
    return 0xf;
  }
  dVar2 = l2norm(jac,N);
  iVar1 = 1;
  if (stoptol <= dVar2 / (double)N) {
    iVar1 = 6;
    if (functol <=
        ABS((double)(~-(ulong)(ABS(fo) < eps) & (ulong)((fx - fo) / fo) |
                    -(ulong)(ABS(fo) < eps) & (ulong)(fx - fo)))) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int stopcheck2_mt(double fx, int N, double fo, double *jac, double *dx, double eps,double stoptol, double functol, int retval) {
	int rcode;
	double nrm,nrmnx,relfit;
	rcode = 0;


	if (retval == 3) {
		rcode = 4;
		return rcode;
	}
	if (retval == 15) {
		rcode = 15;
		return rcode;
	}

	nrm = l2norm(jac, N);
	nrmnx = nrm / (double) N;

	if (fabs(fo) < eps) {
		relfit = fabs(fx - fo);
	}
	else {
		relfit = fabs((fx - fo)/fo);
	}

	if (nrmnx < stoptol) {
		return 1; // Successful Convergence
	} else if (relfit < functol) {
		return 6; // Relative fit less than function tolerance
	}

	return rcode;
}